

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerHLSL::emit_io_block(CompilerHLSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t location;
  SPIREntryPoint *pSVar3;
  SPIRType *type;
  SPIRType *pSVar4;
  Bitset *pBVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  uint32_t index;
  ulong uVar7;
  string semantic;
  string local_90;
  string local_70;
  string local_50;
  
  pSVar3 = Compiler::get_entry_point((Compiler *)this);
  type = Compiler::get<spirv_cross::SPIRType>
                   ((Compiler *)this,*(uint32_t *)&(var->super_IVariant).field_0xc);
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(type->super_IVariant).self.id);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
            (&semantic,this,(ulong)(type->super_IVariant).self.id,1);
  CompilerGLSL::statement<char_const(&)[8],std::__cxx11::string>
            (&this->super_CompilerGLSL,(char (*) [8])"struct ",&semantic);
  ::std::__cxx11::string::~string((string *)&semantic);
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(&(type->member_name_cache)._M_h);
  uVar2 = Compiler::get_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
  for (uVar7 = 0;
      uVar7 < (uint)(type->member_types).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
      uVar7 = uVar7 + 1) {
    semantic._M_dataplus._M_p = (pointer)&semantic.field_2;
    semantic._M_string_length = 0;
    semantic.field_2._M_local_buf[0] = '\0';
    index = (uint32_t)uVar7;
    bVar1 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                       DecorationLocation);
    if (bVar1) {
      location = Compiler::get_member_decoration
                           ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                            DecorationLocation);
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (ulong)pSVar3->model;
      to_semantic_abi_cxx11_(&local_70,this,location,pSVar3->model,var->storage);
      join<char_const(&)[4],std::__cxx11::string>
                (&local_90,(spirv_cross *)0x311100,(char (*) [4])&local_70,pbVar6);
    }
    else {
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (ulong)pSVar3->model;
      to_semantic_abi_cxx11_(&local_70,this,uVar2 + index,pSVar3->model,var->storage);
      join<char_const(&)[4],std::__cxx11::string>
                (&local_90,(spirv_cross *)0x311100,(char (*) [4])&local_70,pbVar6);
    }
    ::std::__cxx11::string::operator=((string *)&semantic,(string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_70);
    CompilerGLSL::add_member_name(&this->super_CompilerGLSL,type,index);
    pSVar4 = Compiler::get<spirv_cross::SPIRType>
                       ((Compiler *)this,
                        (type->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar7].id
                       );
    pBVar5 = Compiler::get_member_decoration_bitset
                       ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x2e])(&local_90,this,pBVar5);
    CompilerGLSL::to_member_name_abi_cxx11_(&local_50,&this->super_CompilerGLSL,type,index);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])
              (&local_70,this,pSVar4,&local_50,0);
    CompilerGLSL::
    statement<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,&local_90,&local_70,&semantic,(char (*) [2])0x304bae);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&semantic);
  }
  CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x303078);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x24])(&semantic,this,var);
  CompilerGLSL::statement<char_const(&)[8],std::__cxx11::string,char_const(&)[2]>
            (&this->super_CompilerGLSL,(char (*) [8])"static ",&semantic,(char (*) [2])0x304bae);
  ::std::__cxx11::string::~string((string *)&semantic);
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x303078);
  return;
}

Assistant:

void CompilerHLSL::emit_io_block(const SPIRVariable &var)
{
	auto &execution = get_entry_point();

	auto &type = get<SPIRType>(var.basetype);
	add_resource_name(type.self);

	statement("struct ", to_name(type.self));
	begin_scope();
	type.member_name_cache.clear();

	uint32_t base_location = get_decoration(var.self, DecorationLocation);

	for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
	{
		string semantic;
		if (has_member_decoration(type.self, i, DecorationLocation))
		{
			uint32_t location = get_member_decoration(type.self, i, DecorationLocation);
			semantic = join(" : ", to_semantic(location, execution.model, var.storage));
		}
		else
		{
			// If the block itself has a location, but not its members, use the implicit location.
			// There could be a conflict if the block members partially specialize the locations.
			// It is unclear how SPIR-V deals with this. Assume this does not happen for now.
			uint32_t location = base_location + i;
			semantic = join(" : ", to_semantic(location, execution.model, var.storage));
		}

		add_member_name(type, i);

		auto &membertype = get<SPIRType>(type.member_types[i]);
		statement(to_interpolation_qualifiers(get_member_decoration_bitset(type.self, i)),
		          variable_decl(membertype, to_member_name(type, i)), semantic, ";");
	}

	end_scope_decl();
	statement("");

	statement("static ", variable_decl(var), ";");
	statement("");
}